

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void cleanup_constants(void)

{
  critical_level *pcVar1;
  critical_level *pcVar2;
  
  pcVar2 = z_info->m_crit_level_head;
  while (pcVar2 != (critical_level *)0x0) {
    pcVar1 = pcVar2->next;
    mem_free(pcVar2);
    pcVar2 = pcVar1;
  }
  pcVar2 = z_info->r_crit_level_head;
  while (pcVar2 != (critical_level *)0x0) {
    pcVar1 = pcVar2->next;
    mem_free(pcVar2);
    pcVar2 = pcVar1;
  }
  mem_free(z_info);
  return;
}

Assistant:

static void cleanup_constants(void)
{
	cleanup_critical_levels(z_info->m_crit_level_head);
	cleanup_critical_levels(z_info->r_crit_level_head);
	mem_free(z_info);
}